

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall argparse::Argument::validate(Argument *this)

{
  bool bVar1;
  __optional_ne_t<unsigned_long,_unsigned_long> _Var2;
  size_type sVar3;
  unsigned_long *puVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  const_reference pvVar7;
  optional<unsigned_long> oVar8;
  byte local_761;
  string local_6f0 [32];
  stringstream local_6d0 [8];
  stringstream stream_3;
  ostream local_6c0 [376];
  size_type local_548;
  undefined1 local_539;
  string local_538 [32];
  stringstream local_518 [8];
  stringstream stream_2;
  ostream local_508 [383];
  undefined1 local_389;
  string local_388 [32];
  stringstream local_368 [8];
  stringstream stream_1;
  ostream local_358 [383];
  undefined1 local_1d9;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream stream;
  ostream local_198 [376];
  _Storage<unsigned_long,_true> local_20;
  optional<unsigned_long> expected;
  Argument *this_local;
  
  expected.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = this;
  oVar8 = maybe_nargs(this);
  local_20._M_value =
       oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  expected.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_20);
  if (bVar1) {
    if ((this->field_0xbc & 1) == 0) {
      local_548 = std::vector<std::any,_std::allocator<std::any>_>::size(&this->mValues);
      _Var2 = std::operator!=(&local_548,(optional<unsigned_long> *)&local_20);
      local_761 = 0;
      if (_Var2) {
        bVar1 = std::any::has_value(&this->mDefaultValue);
        local_761 = bVar1 ^ 0xff;
      }
      if ((local_761 & 1) != 0) {
        std::__cxx11::stringstream::stringstream(local_6d0);
        poVar5 = std::operator<<(local_6c0,(string *)&this->mUsedName);
        poVar5 = std::operator<<(poVar5,": expected ");
        puVar4 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_20);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*puVar4);
        poVar5 = std::operator<<(poVar5," argument(s). ");
        sVar3 = std::vector<std::any,_std::allocator<std::any>_>::size(&this->mValues);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar3);
        std::operator<<(poVar5," provided.");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(prVar6,local_6f0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      if (((byte)this->field_0xbc >> 2 & 1) != 0) {
        sVar3 = std::vector<std::any,_std::allocator<std::any>_>::size(&this->mValues);
        puVar4 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_20);
        if ((sVar3 != *puVar4) && (bVar1 = std::any::has_value(&this->mDefaultValue), !bVar1)) {
          std::__cxx11::stringstream::stringstream(local_1a8);
          poVar5 = std::operator<<(local_198,(string *)&this->mUsedName);
          poVar5 = std::operator<<(poVar5,": expected ");
          puVar4 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_20);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*puVar4);
          poVar5 = std::operator<<(poVar5," argument(s). ");
          sVar3 = std::vector<std::any,_std::allocator<std::any>_>::size(&this->mValues);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar3);
          std::operator<<(poVar5," provided.");
          local_1d9 = 1;
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringstream::str();
          std::runtime_error::runtime_error(prVar6,local_1d8);
          local_1d9 = 0;
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      if (((((byte)this->field_0xbc >> 2 & 1) == 0) &&
          (bVar1 = std::any::has_value(&this->mDefaultValue), !bVar1)) &&
         (((byte)this->field_0xbc >> 1 & 1) != 0)) {
        std::__cxx11::stringstream::stringstream(local_368);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->mNames,0);
        poVar5 = std::operator<<(local_358,(string *)pvVar7);
        std::operator<<(poVar5,": required.");
        local_389 = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(prVar6,local_388);
        local_389 = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (((((byte)this->field_0xbc >> 2 & 1) != 0) && (((byte)this->field_0xbc >> 1 & 1) != 0)) &&
         (sVar3 = std::vector<std::any,_std::allocator<std::any>_>::size(&this->mValues), sVar3 == 0
         )) {
        std::__cxx11::stringstream::stringstream(local_518);
        poVar5 = std::operator<<(local_508,(string *)&this->mUsedName);
        std::operator<<(poVar5,": no value provided.");
        local_539 = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(prVar6,local_538);
        local_539 = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

void validate() const {
    if (auto expected = maybe_nargs()) {
      if (mIsOptional) {
        if (mIsUsed && mValues.size() != *expected &&
            !mDefaultValue.has_value()) {
          std::stringstream stream;
          stream << mUsedName << ": expected " << *expected << " argument(s). "
                 << mValues.size() << " provided.";
          throw std::runtime_error(stream.str());
        } else {
          // TODO: check if an implicit value was programmed for this argument
          if (!mIsUsed && !mDefaultValue.has_value() && mIsRequired) {
            std::stringstream stream;
            stream << mNames[0] << ": required.";
            throw std::runtime_error(stream.str());
          }
          if (mIsUsed && mIsRequired && mValues.size() == 0) {
            std::stringstream stream;
            stream << mUsedName << ": no value provided.";
            throw std::runtime_error(stream.str());
          }
        }
      } else {
        if (mValues.size() != expected && !mDefaultValue.has_value()) {
          std::stringstream stream;
          stream << mUsedName << ": expected " << *expected << " argument(s). "
                 << mValues.size() << " provided.";
          throw std::runtime_error(stream.str());
        }
      }
    }
  }